

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PECore.cpp
# Opt level: O0

bufsize_t __thiscall PECore::getAlignment(PECore *this,addr_type aType)

{
  addr_type aType_local;
  PECore *this_local;
  
  if (this->opt32 == (IMAGE_OPTIONAL_HEADER32 *)0x0) {
    if (this->opt64 == (IMAGE_OPTIONAL_HEADER64 *)0x0) {
      this_local = (PECore *)0x0;
    }
    else if (aType == RAW) {
      this_local = (PECore *)(ulong)this->opt64->FileAlignment;
    }
    else {
      this_local = (PECore *)(ulong)this->opt64->SectionAlignment;
    }
  }
  else if (aType == RAW) {
    this_local = (PECore *)(ulong)this->opt32->FileAlignment;
  }
  else {
    this_local = (PECore *)(ulong)this->opt32->SectionAlignment;
  }
  return (bufsize_t)this_local;
}

Assistant:

bufsize_t PECore::getAlignment(Executable::addr_type aType) const
{
    if (this->opt32) {
        if (aType == Executable::RAW) return opt32->FileAlignment;
        return opt32->SectionAlignment;
    }
    if (this->opt64) {
        if (aType == Executable::RAW) return opt64->FileAlignment;
        return opt64->SectionAlignment;
    }
    return 0;
}